

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O0

bool __thiscall
branch_and_reduce_algorithm::unconfinedReduction_a(branch_and_reduce_algorithm *this)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  value_type vVar3;
  int iVar4;
  bool bVar5;
  vector<int,_std::allocator<int>_> *this_00;
  reference pvVar6;
  reference pvVar7;
  vector<int,_std::allocator<int>_> *pvVar8;
  size_type sVar9;
  reference piVar10;
  undefined8 uVar11;
  vector<int,_std::allocator<int>_> *this_01;
  string local_230;
  allocator<int> local_209;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_208;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_200;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1f8;
  undefined1 local_1f0 [8];
  vector<int,_std::allocator<int>_> copyOfqs_1;
  iterator iStack_1d0;
  int w_5;
  iterator __end9;
  iterator __begin9;
  value_type *__range9;
  int q_1;
  vector<int,_std::allocator<int>_> *qs_1;
  int j;
  int w_4;
  iterator __end6;
  iterator __begin6;
  value_type *__range6;
  int u_3;
  int i_3;
  int t;
  int w_3;
  iterator __end5_2;
  iterator __begin5_2;
  value_type *__range5_2;
  int v2;
  int v1;
  int u_2;
  int i_2;
  vector<int,_std::allocator<int>_> *vs;
  int i_1;
  iterator iStack_138;
  int w_2;
  iterator __end5_1;
  iterator __begin5_1;
  value_type *__range5_1;
  value_type local_118;
  int z_1;
  int vtx;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_108;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_100;
  undefined1 local_f8 [8];
  vector<int,_std::allocator<int>_> copyOfqs;
  iterator iStack_d8;
  int w_1;
  iterator __end7;
  iterator __begin7;
  value_type *__range7;
  int q;
  vector<int,_std::allocator<int>_> *qs;
  iterator iStack_98;
  int w;
  iterator __end5;
  iterator __begin5;
  value_type *__range5;
  int local_78;
  int z;
  int u_1;
  int i;
  vector<int,_std::allocator<int>_> extends;
  bool ok;
  iterator iStack_50;
  int u;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  int local_30;
  int size;
  int p;
  int v;
  vector<int,_std::allocator<int>_> *deg;
  vector<int,_std::allocator<int>_> *NS;
  int oldn;
  branch_and_reduce_algorithm *this_local;
  
  uVar1 = this->rn;
  this_01 = &this->level;
  this_00 = &this->iter;
  size = 0;
  do {
    __stream = _stderr;
    if (this->n <= size) {
      if (((2 < debug) && (this->depth <= this->maxDepth)) && (uVar1 != this->rn)) {
        debugString_abi_cxx11_(&local_230,this);
        uVar11 = std::__cxx11::string::c_str();
        fprintf(__stream,"%sunconfined: %d -> %d\n",uVar11,(ulong)uVar1,(ulong)(uint)this->rn);
        std::__cxx11::string::~string((string *)&local_230);
      }
      return uVar1 != this->rn;
    }
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)size);
    if (*pvVar6 < 0) {
      fast_set::clear(&this->used);
      fast_set::add(&this->used,size);
      local_30 = 1;
      __range3._4_4_ = 0;
      pvVar7 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->adj,(long)size);
      __end3 = std::vector<int,_std::allocator<int>_>::begin(pvVar7);
      iStack_50 = std::vector<int,_std::allocator<int>_>::end(pvVar7);
      while (bVar5 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffffb0), bVar5) {
        piVar10 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator*(&__end3);
        extends.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = *piVar10;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->x,(long)extends.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        if (*pvVar6 < 0) {
          fast_set::add(&this->used,
                        extends.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_);
          vVar3 = extends.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)__range3._4_4_);
          *pvVar6 = vVar3;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (this_00,(long)extends.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)
          ;
          *pvVar6 = 1;
          __range3._4_4_ = __range3._4_4_ + 1;
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end3);
      }
      extends.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._3_1_ = 0;
      do {
        if (((extends.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._3_1_ ^ 0xff) & 1) == 0) break;
        extends.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._3_1_ = 1;
        std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&u_1);
        z = 0;
LAB_0011f0df:
        if (z < __range3._4_4_) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)z);
          local_78 = *pvVar6;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)local_78);
          if (*pvVar6 != 1) goto LAB_0011f465;
          __range5._4_4_ = -1;
          pvVar7 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](&this->adj,(long)local_78);
          __end5 = std::vector<int,_std::allocator<int>_>::begin(pvVar7);
          iStack_98 = std::vector<int,_std::allocator<int>_>::end(pvVar7);
          while (bVar5 = __gnu_cxx::operator!=(&__end5,&stack0xffffffffffffff68), bVar5) {
            piVar10 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                      operator*(&__end5);
            iVar2 = *piVar10;
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)iVar2);
            if (((*pvVar6 < 0) && (bVar5 = fast_set::get(&this->used,iVar2), !bVar5)) &&
               (bVar5 = -1 < __range5._4_4_, __range5._4_4_ = iVar2, bVar5)) {
              __range5._4_4_ = -2;
              break;
            }
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&__end5);
          }
          if (__range5._4_4_ != -1) {
            if (-1 < __range5._4_4_) {
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)&u_1,
                         (value_type_conflict1 *)((long)&__range5 + 4));
            }
            goto LAB_0011f465;
          }
          if (2 < REDUCTION) {
            pvVar8 = &this->que;
            __range7._4_4_ = 1;
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar8,0);
            *pvVar6 = 1;
            pvVar7 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[](&this->adj,(long)size);
            __end7 = std::vector<int,_std::allocator<int>_>::begin(pvVar7);
            iStack_d8 = std::vector<int,_std::allocator<int>_>::end(pvVar7);
            while (bVar5 = __gnu_cxx::operator!=(&__end7,&stack0xffffffffffffff28), bVar5) {
              piVar10 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator*(&__end7);
              copyOfqs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage._4_4_ = *piVar10;
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&this->x,(long)copyOfqs.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                 _4_4_);
              iVar2 = copyOfqs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_;
              if (*pvVar6 < 0) {
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (pvVar8,(long)__range7._4_4_);
                *pvVar6 = iVar2;
                __range7._4_4_ = __range7._4_4_ + 1;
              }
              __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&__end7);
            }
            local_100._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(pvVar8);
            _vtx = std::vector<int,_std::allocator<int>_>::begin(pvVar8);
            local_108 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator+((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)&vtx,(long)__range7._4_4_);
            std::allocator<int>::allocator((allocator<int> *)((long)&z_1 + 3));
            std::vector<int,std::allocator<int>>::
            vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                      ((vector<int,std::allocator<int>> *)local_f8,local_100,local_108,
                       (allocator<int> *)((long)&z_1 + 3));
            std::allocator<int>::~allocator((allocator<int> *)((long)&z_1 + 3));
            pushPacking(this,(vector<int,_std::allocator<int>_> *)local_f8);
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)local_f8);
          }
          set(this,size,1);
          bVar5 = true;
        }
        else {
          sVar9 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)&u_1);
          if (sVar9 != 0) {
            sVar9 = std::vector<int,_std::allocator<int>_>::size
                              ((vector<int,_std::allocator<int>_> *)&u_1);
            if (sVar9 == 1) {
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)&u_1,0);
              local_118 = *pvVar6;
              if (BRANCHING == 0x1f) {
                std::vector<int,_std::allocator<int>_>::push_back(&this->unconf_vtcs,&local_118);
              }
              else {
                std::vector<int,_std::allocator<int>_>::push_back(&this->b_vtcs,&local_118);
              }
            }
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)&u_1,0);
            iVar2 = *pvVar6;
            extends.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._3_1_ = 0;
            fast_set::add(&this->used,iVar2);
            local_30 = local_30 + 1;
            pvVar7 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[](&this->adj,(long)iVar2);
            __end5_1 = std::vector<int,_std::allocator<int>_>::begin(pvVar7);
            iStack_138 = std::vector<int,_std::allocator<int>_>::end(pvVar7);
            while (bVar5 = __gnu_cxx::operator!=(&__end5_1,&stack0xfffffffffffffec8), bVar5) {
              piVar10 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator*(&__end5_1);
              iVar2 = *piVar10;
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)iVar2);
              if (*pvVar6 < 0) {
                bVar5 = fast_set::add(&this->used,iVar2);
                if (bVar5) {
                  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (this_01,(long)__range3._4_4_);
                  *pvVar6 = iVar2;
                  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)iVar2);
                  *pvVar6 = 1;
                  __range3._4_4_ = __range3._4_4_ + 1;
                }
                else {
                  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)iVar2);
                  *pvVar6 = *pvVar6 + 1;
                }
              }
              __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&__end5_1);
            }
          }
          bVar5 = false;
        }
        std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&u_1);
      } while (!bVar5);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)size);
      if ((*pvVar6 < 0) && (1 < local_30)) {
        fast_set::clear(&this->used);
        for (vs._4_4_ = 0; vs._4_4_ < __range3._4_4_; vs._4_4_ = vs._4_4_ + 1) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)vs._4_4_);
          fast_set::add(&this->used,*pvVar6);
        }
        pvVar8 = &this->que;
        for (v1 = 0; v1 < __range3._4_4_; v1 = v1 + 1) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar8,(long)(this->n + v1));
          *pvVar6 = -1;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar8,(long)v1);
          *pvVar6 = -1;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)v1);
          iVar2 = *pvVar6;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)iVar2);
          if (*pvVar6 == 2) {
            __range5_2._4_4_ = -1;
            __range5_2._0_4_ = -1;
            pvVar7 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[](&this->adj,(long)iVar2);
            __end5_2 = std::vector<int,_std::allocator<int>_>::begin(pvVar7);
            _t = std::vector<int,_std::allocator<int>_>::end(pvVar7);
            while (bVar5 = __gnu_cxx::operator!=
                                     (&__end5_2,
                                      (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                       *)&t), bVar5) {
              piVar10 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator*(&__end5_2);
              iVar2 = *piVar10;
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)iVar2);
              iVar4 = __range5_2._4_4_;
              if ((((*pvVar6 < 0) && (bVar5 = fast_set::get(&this->used,iVar2), !bVar5)) &&
                  (iVar4 = iVar2, -1 < __range5_2._4_4_)) &&
                 (bVar5 = -1 < (int)__range5_2, __range5_2._0_4_ = iVar2, iVar4 = __range5_2._4_4_,
                 bVar5)) {
                __range5_2._0_4_ = -1;
                __range5_2._4_4_ = -1;
                break;
              }
              __range5_2._4_4_ = iVar4;
              __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&__end5_2);
            }
            iVar2 = __range5_2._4_4_;
            if ((int)__range5_2 < __range5_2._4_4_) {
              __range5_2._4_4_ = (int)__range5_2;
              __range5_2._0_4_ = iVar2;
            }
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar8,(long)v1);
            *pvVar6 = __range5_2._4_4_;
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar8,(long)(this->n + v1))
            ;
            *pvVar6 = (int)__range5_2;
          }
        }
        for (__range6._4_4_ = 0; __range6._4_4_ < __range3._4_4_;
            __range6._4_4_ = __range6._4_4_ + 1) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar8,(long)__range6._4_4_);
          if ((-1 < *pvVar6) &&
             (pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (pvVar8,(long)(this->n + __range6._4_4_)), -1 < *pvVar6)) {
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                               (this_01,(long)__range6._4_4_);
            iVar2 = *pvVar6;
            fast_set::clear(&this->used);
            pvVar7 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[](&this->adj,(long)iVar2);
            __end6 = std::vector<int,_std::allocator<int>_>::begin(pvVar7);
            _j = std::vector<int,_std::allocator<int>_>::end(pvVar7);
            while (bVar5 = __gnu_cxx::operator!=
                                     (&__end6,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                               *)&j), qs_1._0_4_ = __range6._4_4_, bVar5) {
              piVar10 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator*(&__end6);
              iVar2 = *piVar10;
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)iVar2);
              if (*pvVar6 < 0) {
                fast_set::add(&this->used,iVar2);
              }
              __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&__end6);
            }
            while (qs_1._0_4_ = (int)qs_1 + 1, (int)qs_1 < __range3._4_4_) {
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (pvVar8,(long)__range6._4_4_);
              iVar2 = *pvVar6;
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar8,(long)(int)qs_1);
              if (iVar2 == *pvVar6) {
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (pvVar8,(long)(this->n + __range6._4_4_));
                iVar2 = *pvVar6;
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (pvVar8,(long)(this->n + (int)qs_1));
                if (iVar2 == *pvVar6) {
                  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (this_01,(long)(int)qs_1);
                  bVar5 = fast_set::get(&this->used,*pvVar6);
                  if (!bVar5) {
                    if (2 < REDUCTION) {
                      pvVar8 = &this->que;
                      __range9._4_4_ = 1;
                      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar8,0);
                      *pvVar6 = 1;
                      pvVar7 = std::
                               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ::operator[](&this->adj,(long)size);
                      __end9 = std::vector<int,_std::allocator<int>_>::begin(pvVar7);
                      iStack_1d0 = std::vector<int,_std::allocator<int>_>::end(pvVar7);
                      while (bVar5 = __gnu_cxx::operator!=(&__end9,&stack0xfffffffffffffe30), bVar5)
                      {
                        piVar10 = __gnu_cxx::
                                  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  ::operator*(&__end9);
                        copyOfqs_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_ = *piVar10;
                        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                           (&this->x,(long)copyOfqs_1.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _4_4_);
                        iVar2 = copyOfqs_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._4_4_;
                        if (*pvVar6 < 0) {
                          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                             (pvVar8,(long)__range9._4_4_);
                          *pvVar6 = iVar2;
                          __range9._4_4_ = __range9._4_4_ + 1;
                        }
                        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator++(&__end9);
                      }
                      local_1f8._M_current =
                           (int *)std::vector<int,_std::allocator<int>_>::begin(pvVar8);
                      local_208._M_current =
                           (int *)std::vector<int,_std::allocator<int>_>::begin(pvVar8);
                      local_200 = __gnu_cxx::
                                  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  ::operator+(&local_208,(long)__range9._4_4_);
                      std::allocator<int>::allocator(&local_209);
                      std::vector<int,std::allocator<int>>::
                      vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                                ((vector<int,std::allocator<int>> *)local_1f0,local_1f8,local_200,
                                 &local_209);
                      std::allocator<int>::~allocator(&local_209);
                      pushPacking(this,(vector<int,_std::allocator<int>_> *)local_1f0);
                      std::vector<int,_std::allocator<int>_>::~vector
                                ((vector<int,_std::allocator<int>_> *)local_1f0);
                    }
                    set(this,size,1);
                    goto LAB_0011fe0a;
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_0011fe0a:
    size = size + 1;
  } while( true );
LAB_0011f465:
  z = z + 1;
  goto LAB_0011f0df;
}

Assistant:

bool branch_and_reduce_algorithm::unconfinedReduction_a()
{
    int oldn = rn;
#if 1
    std::vector<int> &NS = level;
    std::vector<int> &deg = iter;
    for (int v = 0; v < n; v++)
        if (x[v] < 0)
        {
            used.clear();
            used.add(v); // add v to set S
            int p = 1, size = 0;
            for (int u : adj[v]) // add N(v) to set S
                if (x[u] < 0)
                {
                    used.add(u);
                    NS[size++] = u;
                    deg[u] = 1;
                }
            bool ok = false;

            while (!ok) //
            {
                ok = true;
                std::vector<int> extends;

                for (int i = 0; i < size; i++)
                {
                    int const u = NS[i];
                    if (deg[u] != 1)
                    {
                        continue;
                    }
                    int z = -1;
                    for (int const w : adj[u])
                        if (x[w] < 0 && !used.get(w)) // w is in N(u) but not N(S)
                        {
                            if (z >= 0)
                            {
                                z = -2; // |N(u)\N(S)| >= 2
                                break;
                            }
                            z = w;
                        }
                    if (z == -1) // u is child with N(u)\N(S) = 0
                    {
                        if (REDUCTION >= 3)
                        {
                            std::vector<int> &qs = que;
                            int q = 0;
                            qs[q++] = 1;
                            for (int w : adj[v])
                                if (x[w] < 0)
                                    qs[q++] = w;
                            std::vector<int> copyOfqs(qs.begin(), qs.begin() + q);
                            pushPacking(copyOfqs);
                        }
                        set(v, 1);
                        goto whileloopend;
                    }
                    else if (z >= 0) // u is extending child
                    {
                        extends.push_back(z);
                    }
                }

                if (extends.size() > 0)
                {
                    if (extends.size() == 1)
                    {
                        // unconf_vtcs.push_back(extends[0]);
                        int vtx = extends[0];
                        if (BRANCHING == 31) unconf_vtcs.push_back(vtx);
                        else b_vtcs.push_back(vtx);
                    }
                    int z = extends[0];
                    ok = false;
                    used.add(z);
                    p++;
                    for (int w : adj[z])
                        if (x[w] < 0)
                        {
                            if (used.add(w))
                            {
                                NS[size++] = w;
                                deg[w] = 1;
                            }
                            else
                            {
                                deg[w]++;
                            }
                        }
                }
            }
        whileloopend:
            if (x[v] < 0 && p >= 2)
            {
                used.clear();
                for (int i = 0; i < size; i++)
                    used.add(NS[i]);
                std::vector<int> &vs = que;
                for (int i = 0; i < size; i++)
                {
                    vs[i] = vs[n + i] = -1;
                    int u = NS[i];
                    if (deg[u] != 2)
                        continue;
                    int v1 = -1, v2 = -1;
                    for (int w : adj[u])
                        if (x[w] < 0 && !used.get(w))
                        {
                            if (v1 < 0)
                                v1 = w;
                            else if (v2 < 0)
                                v2 = w;
                            else
                            {
                                v1 = v2 = -1;
                                break;
                            }
                        }
                    if (v1 > v2)
                    {
                        int t = v1;
                        v1 = v2;
                        v2 = t;
                    }
                    vs[i] = v1;
                    vs[n + i] = v2;
                }
                for (int i = 0; i < size; i++)
                    if (vs[i] >= 0 && vs[n + i] >= 0)
                    {
                        int u = NS[i];
                        used.clear();
                        for (int w : adj[u])
                            if (x[w] < 0)
                                used.add(w);
                        for (int j = i + 1; j < size; j++)
                            if (vs[i] == vs[j] && vs[n + i] == vs[n + j] && !used.get(NS[j]))
                            {
                                if (REDUCTION >= 3)
                                {
                                    std::vector<int> &qs = que;
                                    int q = 0;
                                    qs[q++] = 1;
                                    for (int w : adj[v])
                                        if (x[w] < 0)
                                            qs[q++] = w;
                                    std::vector<int> copyOfqs(qs.begin(), qs.begin() + q);
                                    pushPacking(copyOfqs);
                                }
                                set(v, 1);
                                goto forloopend;
                            }
                    }
            forloopend:;
            }
        }
    if (debug >= 3 && depth <= maxDepth && oldn != rn)
        fprintf(stderr, "%sunconfined: %d -> %d\n", debugString().c_str(), oldn, rn);
#endif //0
    return oldn != rn;
}